

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hold_ptr.h
# Opt level: O0

void __thiscall
booster::hold_ptr<cppcms::application::_data>::~hold_ptr(hold_ptr<cppcms::application::_data> *this)

{
  service *psVar1;
  _data *in_RDI;
  
  if ((in_RDI->service != (service *)0x0) && (psVar1 = in_RDI->service, psVar1 != (service *)0x0)) {
    cppcms::application::_data::~_data(in_RDI);
    operator_delete(psVar1);
  }
  return;
}

Assistant:

~hold_ptr() 
		{
			if(ptr_) delete ptr_;
		}